

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O2

reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>,_asio::any_io_executor>
* asio::detail::
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>,_asio::any_io_executor>
  ::ptr::allocate(read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
                  *handler)

{
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>,_asio::any_io_executor>
  *prVar1;
  template_rebind_alloc<reactive_socket_recv_op<mutable_buffers_1,_read_op<basic_stream_socket<tcp>,_mutable_buffers_1,_const_mutable_buffer_*,_transfer_all_t,__Bind<void_(rpc_session::*(shared_ptr<rpc_session>,_shared_ptr<buffer>,__Placeholder<1>,__Placeholder<2>))(shared_ptr<buffer>,_const_error_code_&,_unsigned_long)>_>,_any_io_executor>_>
  a;
  
  prVar1 = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>,_asio::any_io_executor>
            *)asio_handler_allocate(0xf0,&handler->handler_);
  return prVar1;
}

Assistant:

inline asio_handler_allocate_is_deprecated
  asio_handler_allocate(std::size_t size,
      read_op<AsyncReadStream, MutableBufferSequence, MutableBufferIterator,
        CompletionCondition, ReadHandler>* this_handler)
  {
#if defined(ASIO_NO_DEPRECATED)
    asio_handler_alloc_helpers::allocate(size, this_handler->handler_);
    return asio_handler_allocate_is_no_longer_used();
#else // defined(ASIO_NO_DEPRECATED)
    return asio_handler_alloc_helpers::allocate(
        size, this_handler->handler_);
#endif // defined(ASIO_NO_DEPRECATED)
  }